

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O3

TextDisplayer * TextDisplayer::getInstance(void)

{
  TextDisplayer *pTVar1;
  Alphabet *pAVar2;
  Palette *pPVar3;
  PrimitiveDisplayer *pPVar4;
  
  if (textDisplayer == (TextDisplayer *)0x0) {
    pTVar1 = (TextDisplayer *)operator_new(0x18);
    pAVar2 = Alphabet::getInstance();
    pTVar1->alphabet = pAVar2;
    pPVar3 = Palette::getInstance();
    pTVar1->palette = pPVar3;
    pPVar4 = PrimitiveDisplayer::getInstance();
    pTVar1->primitiveDisplayer = pPVar4;
    textDisplayer = pTVar1;
  }
  return textDisplayer;
}

Assistant:

TextDisplayer* TextDisplayer::getInstance() {
    if (textDisplayer == nullptr) {
        textDisplayer = new TextDisplayer();
    }
    return textDisplayer;
}